

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O3

Gia_ManTer_t * Gia_ManTerCreate(Gia_Man_t *pAig)

{
  uint uVar1;
  uint uVar2;
  Gia_ManTer_t *pGVar3;
  Gia_Man_t *pGVar4;
  uint *puVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  int *piVar8;
  uint **ppuVar9;
  Vec_Int_t *pVVar10;
  char *pcVar11;
  uint uVar12;
  int iVar13;
  size_t __nmemb;
  
  pGVar3 = (Gia_ManTer_t *)calloc(1,0x68);
  pGVar4 = Gia_ManFront(pAig);
  pGVar3->pAig = pGVar4;
  pGVar3->nIters = 300;
  puVar5 = (uint *)malloc((long)(int)(((pGVar4->nFront >> 4) + 1) -
                                     (uint)((pGVar4->nFront & 0xfU) == 0)) << 2);
  pGVar3->pDataSim = puVar5;
  uVar12 = pGVar4->vCis->nSize;
  puVar5 = (uint *)malloc((long)(int)((((int)uVar12 >> 4) + 1) - (uint)((uVar12 & 0xf) == 0)) << 2);
  pGVar3->pDataSimCis = puVar5;
  uVar12 = pGVar4->vCos->nSize;
  puVar5 = (uint *)malloc((long)(int)((((int)uVar12 >> 4) + 1) - (uint)((uVar12 & 0xf) == 0)) << 2);
  pGVar3->pDataSimCos = puVar5;
  uVar12 = pAig->nRegs;
  __nmemb = (size_t)(int)uVar12;
  pGVar3->nStateWords = (((int)uVar12 >> 4) + 1) - (uint)((uVar12 & 0xf) == 0);
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(8000);
  pVVar6->pArray = ppvVar7;
  pGVar3->vStates = pVVar6;
  piVar8 = (int *)calloc(__nmemb,4);
  pGVar3->pCount0 = piVar8;
  piVar8 = (int *)calloc(__nmemb,4);
  pGVar3->pCountX = piVar8;
  uVar12 = 499;
  while( true ) {
    do {
      uVar1 = uVar12 + 1;
      uVar2 = uVar12 & 1;
      uVar12 = uVar1;
    } while (uVar2 != 0);
    if (uVar1 < 9) break;
    iVar13 = 5;
    while (uVar1 % (iVar13 - 2U) != 0) {
      uVar2 = iVar13 * iVar13;
      iVar13 = iVar13 + 2;
      if (uVar1 < uVar2) goto LAB_0074276b;
    }
  }
LAB_0074276b:
  pGVar3->nBins = uVar1;
  ppuVar9 = (uint **)calloc((long)(int)uVar1,8);
  pGVar3->pBins = ppuVar9;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 100;
  pVVar10->nSize = 0;
  piVar8 = (int *)malloc(400);
  pVVar10->pArray = piVar8;
  pGVar3->vRetired = pVVar10;
  pcVar11 = (char *)calloc(__nmemb,1);
  pGVar3->pRetired = pcVar11;
  return pGVar3;
}

Assistant:

Gia_ManTer_t * Gia_ManTerCreate( Gia_Man_t * pAig )
{
    Gia_ManTer_t * p;
    p = ABC_CALLOC( Gia_ManTer_t, 1 );
    p->pAig   = Gia_ManFront( pAig );
    p->nIters = 300;
    p->pDataSim    = ABC_ALLOC( unsigned, Abc_BitWordNum(2*p->pAig->nFront) );
    p->pDataSimCis = ABC_ALLOC( unsigned, Abc_BitWordNum(2*Gia_ManCiNum(p->pAig)) );
    p->pDataSimCos = ABC_ALLOC( unsigned, Abc_BitWordNum(2*Gia_ManCoNum(p->pAig)) );
    // allocate storage for terminary states
    p->nStateWords = Abc_BitWordNum( 2*Gia_ManRegNum(pAig) );
    p->vStates  = Vec_PtrAlloc( 1000 );
    p->pCount0  = ABC_CALLOC( int, Gia_ManRegNum(pAig) );
    p->pCountX  = ABC_CALLOC( int, Gia_ManRegNum(pAig) );
    p->nBins    = Abc_PrimeCudd( 500 );
    p->pBins    = ABC_CALLOC( unsigned *, p->nBins );
    p->vRetired = Vec_IntAlloc( 100 );
    p->pRetired = ABC_CALLOC( char, Gia_ManRegNum(pAig) );
    return p;
}